

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFileOpenDialog::setDirectoryName(CGUIFileOpenDialog *this,path *name)

{
  string<char> *in_RDI;
  stringw *result;
  string<char> *in_stack_ffffffffffffffc0;
  CGUIFileOpenDialog *this_00;
  undefined1 local_30 [48];
  
  core::string<char>::operator=(in_RDI,in_stack_ffffffffffffffc0);
  core::string<char>::operator=(in_RDI,in_stack_ffffffffffffffc0);
  result = *(stringw **)&in_RDI[0x12].str.field_2;
  this_00 = (CGUIFileOpenDialog *)(in_RDI + 0xd);
  core::string<char>::string<char>((string<char> *)this_00,(char *)result);
  (**(code **)(*(long *)result + 0xb0))(result,this_00,local_30);
  core::string<char>::~string((string<char> *)0x3b7dac);
  pathToStringW(this_00,result,(path *)0x3b7dca);
  return;
}

Assistant:

void CGUIFileOpenDialog::setDirectoryName(const irr::io::path &name)
{
	FileDirectory = name;
	FileDirectoryFlat = name;
	FileSystem->flattenFilename(FileDirectoryFlat);
	pathToStringW(FileDirectoryFlatW, FileDirectoryFlat);
}